

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_its_file.c
# Opt level: O0

psa_status_t psa_its_read_file(psa_storage_uid_t uid,psa_storage_info_t *p_info,FILE **p_stream)

{
  FILE *pFVar1;
  size_t sVar2;
  size_t n;
  psa_its_file_header_t header;
  char filename [25];
  FILE **p_stream_local;
  psa_storage_info_t *p_info_local;
  psa_storage_uid_t uid_local;
  
  *p_stream = (FILE *)0x0;
  psa_its_fill_filename(uid,(char *)header.size);
  pFVar1 = fopen((char *)header.size,"rb");
  *p_stream = (FILE *)pFVar1;
  if (*p_stream == (FILE *)0x0) {
    uid_local._4_4_ = -0x8c;
  }
  else {
    sVar2 = fread(&n,1,0x10,(FILE *)*p_stream);
    if (sVar2 == 0x10) {
      if (n == 0x53544900415350) {
        p_info->size = header.magic._0_4_;
        p_info->flags = header.magic._4_4_;
        uid_local._4_4_ = 0;
      }
      else {
        uid_local._4_4_ = -0x98;
      }
    }
    else {
      uid_local._4_4_ = -0x98;
    }
  }
  return uid_local._4_4_;
}

Assistant:

static psa_status_t psa_its_read_file( psa_storage_uid_t uid,
                                       struct psa_storage_info_t *p_info,
                                       FILE **p_stream )
{
    char filename[PSA_ITS_STORAGE_FILENAME_LENGTH];
    psa_its_file_header_t header;
    size_t n;

    *p_stream = NULL;
    psa_its_fill_filename( uid, filename );
    *p_stream = fopen( filename, "rb" );
    if( *p_stream == NULL )
        return( PSA_ERROR_DOES_NOT_EXIST );

    n = fread( &header, 1, sizeof( header ), *p_stream );
    if( n != sizeof( header ) )
        return( PSA_ERROR_DATA_CORRUPT );
    if( memcmp( header.magic, PSA_ITS_MAGIC_STRING,
                PSA_ITS_MAGIC_LENGTH ) != 0 )
        return( PSA_ERROR_DATA_CORRUPT );

    p_info->size = ( header.size[0] |
                     header.size[1] << 8 |
                     header.size[2] << 16 |
                     header.size[3] << 24 );
    p_info->flags = ( header.flags[0] |
                      header.flags[1] << 8 |
                      header.flags[2] << 16 |
                      header.flags[3] << 24 );
    return( PSA_SUCCESS );
}